

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O0

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::stop(demand_queue_t *this)

{
  type lock_00;
  lock_guard_t local_18;
  lock_guard_t lock;
  demand_queue_t *this_local;
  
  lock.m_lock = (lock_t *)this;
  lock_00 = std::
            unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
            ::operator*(&this->m_lock);
  mpsc_queue_traits::lock_guard_t::lock_guard_t(&local_18,lock_00);
  this->m_shutdown = true;
  if (this->m_total_demands_count == 0) {
    mpsc_queue_traits::lock_guard_t::notify_one(&local_18);
  }
  mpsc_queue_traits::lock_guard_t::~lock_guard_t(&local_18);
  return;
}

Assistant:

void
		stop()
			{
				queue_traits::lock_guard_t lock{ *m_lock };

				m_shutdown = true;

				if( !m_total_demands_count )
					// There could be a sleeping working thread.
					// It must be notified.
					lock.notify_one();
			}